

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmemory.cpp
# Opt level: O2

BOOL SHMSetInfo(SHM_INFO_ID element,SHMPTR value)

{
  void *pvVar1;
  BOOL BVar2;
  
  if ((int)element < 3) {
    pvVar1 = (void *)pthread_self();
    if (locking_thread.m_val != pvVar1) {
      fprintf(_stderr,"] %s %s:%d","SHMSetInfo",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
              ,0x3bc);
      fprintf(_stderr,"SHMGetInfo called while thread does not hold the SHM lock!\n");
    }
    if (PAL_InitializeChakraCoreCalled == false) {
      abort();
    }
    *(SHMPTR *)((long)shm_segment_bases[0].m_val + (ulong)element * 8 + 0xa8) = value;
    BVar2 = 1;
  }
  else {
    BVar2 = 0;
    fprintf(_stderr,"] %s %s:%d","SHMSetInfo",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
            ,0x3b4);
    fprintf(_stderr,"Invalid SHM info element %d\n",(ulong)element);
  }
  return BVar2;
}

Assistant:

BOOL SHMSetInfo(SHM_INFO_ID element, SHMPTR value)
{
    SHM_FIRST_HEADER *header;

    if(element >= SIID_LAST)
    {
        ASSERT("Invalid SHM info element %d\n", element);
        return FALSE;
    }

    /* verify that this thread holds the SHM lock. No race condition: if the
       current thread is here, it can't be in SHMLock or SHMUnlock */
    if( (HANDLE)pthread_self() != locking_thread )
    {
        ASSERT("SHMGetInfo called while thread does not hold the SHM lock!\n");
    }

    header = (SHM_FIRST_HEADER*)shm_segment_bases[0].Load();

    TRACE("Setting SHM info element %d to %08x; used to be %08x\n",
          element, value, header->shm_info[element].Load() );

    header->shm_info[element] = value;

    return TRUE;
}